

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.h
# Opt level: O3

bool __thiscall
CCommandBuffer::AddCommand<CCommandBuffer::CRenderCommand>
          (CCommandBuffer *this,CRenderCommand *Command)

{
  uint uVar1;
  uchar *puVar2;
  long lVar3;
  undefined4 uVar4;
  long lVar5;
  CCommand *pCVar6;
  ulong uVar7;
  CCommand *pCVar8;
  ulong uVar9;
  
  puVar2 = (this->m_CmdBuffer).m_pData;
  uVar1 = (this->m_CmdBuffer).m_Used;
  uVar9 = (ulong)((int)puVar2 + uVar1 & 7);
  uVar7 = (uVar1 - uVar9) + 0x68;
  if (uVar7 <= (this->m_CmdBuffer).m_Size) {
    lVar3 = uVar1 - uVar9;
    (this->m_CmdBuffer).m_Used = (uint)uVar7;
    pCVar6 = (CCommand *)(puVar2 + lVar3 + 8);
    if (pCVar6 != (CCommand *)0x0) {
      pCVar8 = pCVar6;
      for (lVar5 = 0xc; lVar5 != 0; lVar5 = lVar5 + -1) {
        uVar4 = *(undefined4 *)&(Command->super_CCommand).field_0x4;
        pCVar8->m_Cmd = (Command->super_CCommand).m_Cmd;
        *(undefined4 *)&pCVar8->field_0x4 = uVar4;
        Command = (CRenderCommand *)&(Command->super_CCommand).m_pNext;
        pCVar8 = (CCommand *)&pCVar8->m_pNext;
      }
      puVar2 = puVar2 + lVar3 + 0x10;
      puVar2[0] = '\0';
      puVar2[1] = '\0';
      puVar2[2] = '\0';
      puVar2[3] = '\0';
      puVar2[4] = '\0';
      puVar2[5] = '\0';
      puVar2[6] = '\0';
      puVar2[7] = '\0';
      if (this->m_pCmdBufferTail != (CCommand *)0x0) {
        this->m_pCmdBufferTail->m_pNext = pCVar6;
      }
      if (this->m_pCmdBufferHead == (CCommand *)0x0) {
        this->m_pCmdBufferHead = pCVar6;
      }
      this->m_pCmdBufferTail = pCVar6;
      return true;
    }
  }
  return false;
}

Assistant:

bool AddCommand(const T &Command)
	{
		// make sure that we don't do something stupid like ->AddCommand(&Cmd);
		(void)static_cast<const CCommand *>(&Command);

		// allocate and copy the command into the buffer
		T *pCmd = (T *)m_CmdBuffer.Alloc(sizeof(*pCmd), 8); // TODO: use alignof(T)
		if(!pCmd)
			return false;
		*pCmd = Command;
		pCmd->m_pNext = 0;

		if(m_pCmdBufferTail)
			m_pCmdBufferTail->m_pNext = pCmd;
		if(!m_pCmdBufferHead)
			m_pCmdBufferHead = pCmd;
		m_pCmdBufferTail = pCmd;

		return true;
	}